

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_undisguise(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  int in_stack_000000ec;
  CHAR_DATA *in_stack_000000f0;
  void *in_stack_ffffffffffffffe8;
  
  bVar1 = is_affected(in_RDI,(int)gsn_disguise);
  if ((bVar1) && (in_RDI->pcdata->old != (OLD_CHAR *)0x0)) {
    act((char *)unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    act((char *)unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    affect_strip(unaff_retaddr,iVar2);
    WAIT_STATE(unaff_retaddr,iVar2);
  }
  else {
    iVar2 = get_skill(in_stack_000000f0,in_stack_000000ec);
    if (iVar2 < 1) {
      send_to_char((char *)unaff_retaddr,in_RDI);
    }
    else {
      send_to_char((char *)unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

void do_undisguise(CHAR_DATA *ch, char *argument)
{
	if (!is_affected(ch, gsn_disguise) || !ch->pcdata->old)
	{
		if (get_skill(ch, gsn_disguise) < 1)
		{
			send_to_char("Huh?\n\r", ch);
			return;
		}
		else
		{
			send_to_char("You are not disguised!\n\r", ch);
			return;
		}
	}

	act("$n suddenly slips out of $s garb... revealing $t beneath the disguise!", ch, ch->pcdata->old->name, 0, TO_ROOM);
	act("You deftly slip out of your disguise and cast it aside.", ch, 0, 0, TO_CHAR);

	affect_strip(ch, gsn_disguise);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}